

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCACore.cpp
# Opt level: O0

void __thiscall Js::SCACore::Serializer::WriteRawBytes(Serializer *this,void *source,size_t length)

{
  ScriptContext *scriptContext_00;
  void *unaff_retaddr;
  undefined1 local_90 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  ScriptContext *scriptContext;
  size_t length_local;
  void *source_local;
  Serializer *this_local;
  
  scriptContext_00 = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this);
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_90,scriptContext_00,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             true,false,false);
  ScriptContext::OnScriptStart(scriptContext_00,false,true);
  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_90);
  StreamWriter::Write(&this->m_streamWriter,source,length);
  EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_90);
  return;
}

Assistant:

void Serializer::WriteRawBytes(const void* source, size_t length)
        {
            ScriptContext *scriptContext = m_streamWriter.GetScriptContext();
            BEGIN_JS_RUNTIME_CALL(scriptContext)
            {
                m_streamWriter.Write(source, length);
            }
            END_JS_RUNTIME_CALL(scriptContext)
        }